

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderLimits.hpp
# Opt level: O3

void __thiscall
glcts::GeometryShaderMaxInputComponentsTest::~GeometryShaderMaxInputComponentsTest
          (GeometryShaderMaxInputComponentsTest *this)

{
  ~GeometryShaderMaxInputComponentsTest(this);
  operator_delete(this,0x368);
  return;
}

Assistant:

virtual ~GeometryShaderMaxInputComponentsTest()
	{
	}